

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::WindGroup::append
          (WindGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  Runway *__u;
  WindGroup *in_RDI;
  optional<metaf::Runway> oVar4;
  string *in_stack_00000010;
  WindGroup *in_stack_00000018;
  ReportMetadata *in_stack_00000028;
  optional<metaf::Runway> r;
  WindGroup *in_stack_00000038;
  ReportMetadata *in_stack_00000138;
  string *in_stack_00000140;
  WindGroup *in_stack_00000148;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  optional<metaf::Runway> *in_stack_ffffffffffffffb0;
  undefined4 local_48;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 enableRwy;
  string *in_stack_ffffffffffffffd0;
  AppendResult local_4;
  
  enableRwy = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  __u = (Runway *)(ulong)in_RDI->incompleteText;
  switch(__u) {
  case (Runway *)0x0:
    TVar3 = type(in_RDI);
    if (TVar3 == SURFACE_WIND) {
      local_4 = appendVariableSector(in_stack_00000018,in_stack_00000010);
    }
    else if (TVar3 == WIND_SHIFT) {
      local_4 = appendWindShift(in_stack_00000038,
                                (string *)
                                r.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
                                super__Optional_payload_base<metaf::Runway>._4_8_,in_stack_00000028)
      ;
    }
    else {
      local_4 = NOT_APPENDED;
    }
    break;
  case (Runway *)0x1:
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98));
    if (bVar2) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = PK_WND;
      local_4 = APPENDED;
    }
    break;
  case (Runway *)0x2:
    local_4 = appendPeakWind(in_stack_00000148,in_stack_00000140,in_stack_00000138);
    break;
  case (Runway *)0x3:
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98));
    if (bVar2) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = NONE;
      local_4 = APPENDED;
    }
    break;
  case (Runway *)0x4:
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98));
    if (bVar2) {
      in_RDI->incompleteText = WS_ALL;
      local_4 = APPENDED;
    }
    else {
      oVar4 = Runway::fromString(in_stack_ffffffffffffffd0,(bool)enableRwy);
      local_48 = CONCAT31(local_48._1_3_,
                          oVar4.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
                          super__Optional_payload_base<metaf::Runway>._M_engaged);
      bVar2 = std::optional<metaf::Runway>::has_value((optional<metaf::Runway> *)0x2418ad);
      if (bVar2) {
        in_RDI->incompleteText = NONE;
        (in_RDI->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Runway>._M_payload =
             oVar4.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Runway>._M_payload;
        *(undefined4 *)
         &(in_RDI->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Runway>._M_engaged = local_48;
        local_4 = APPENDED;
      }
      else {
        local_4 = GROUP_INVALIDATED;
      }
    }
    break;
  case (Runway *)0x5:
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98));
    if (bVar2) {
      local_4 = GROUP_INVALIDATED;
    }
    else {
      in_RDI->incompleteText = NONE;
      Runway::makeAllRunways();
      std::optional<metaf::Runway>::operator=(in_stack_ffffffffffffffb0,__u);
      local_4 = APPENDED;
    }
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_4;
}

Assistant:

AppendResult WindGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportPart; (void)reportMetadata;
	//Append variable wind sector group to surface wind group
	switch (incompleteText) {
		case IncompleteText::NONE:
		switch (type()) {
			case Type::SURFACE_WIND: return appendVariableSector(group);
			case Type::WIND_SHIFT: return appendWindShift(group, reportMetadata);
			default: return AppendResult::NOT_APPENDED;
		}
		
		case IncompleteText::PK:
		if (group != "WND") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::PK_WND;
		return AppendResult::APPENDED;		

		case IncompleteText::PK_WND:
		return appendPeakWind(group, reportMetadata);

		case IncompleteText::WND:
		if (group != "MISG") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::APPENDED;

		case IncompleteText::WS_ALL:
		if (group != "RWY") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		rw = Runway::makeAllRunways();
		return AppendResult::APPENDED;

		case IncompleteText::WS:
		if (group == "ALL") {
			incompleteText =  IncompleteText::WS_ALL;
			return AppendResult::APPENDED;
		}
		if (const auto r = Runway::fromString(group, true); r.has_value()) {
			incompleteText = IncompleteText::NONE;
			rw = r;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;
	}
}